

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdBot.cpp
# Opt level: O2

void setupSignalHandler(void)

{
  pointer *__ptr;
  long lVar1;
  long *local_28;
  thread local_20;
  
  std::mutex::lock(&signalMutex);
  for (lVar1 = 0; lVar1 != 0x14; lVar1 = lVar1 + 4) {
    signal(*(int *)((long)&DAT_00164360 + lVar1),signalHandler);
  }
  local_20._M_id._M_thread = (id)0;
  local_28 = (long *)operator_new(0x10);
  *local_28 = (long)&PTR___State_0019bae0;
  std::thread::_M_start_thread(&local_20,&local_28,0);
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 8))();
  }
  std::thread::operator=(&signalThread,&local_20);
  std::thread::~thread(&local_20);
  return;
}

Assistant:

void setupSignalHandler() {
    signalMutex.lock();

    for (auto sig : { SIGABRT, SIGFPE, SIGINT, SIGSEGV, SIGTERM }) {
        std::signal(sig, signalHandler);
    }

    signalThread = std::thread([&]() {
        std::unique_lock<std::mutex> lock(signalMutex);
        spdlog::critical("Received signal: {}", receivedSignal);
        spdlog::shutdown();
        std::exit(-1);
    });
}